

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O0

void GPU_MatrixPerspective(float *result,float fovy,float aspect,float z_near,float z_far)

{
  float fVar1;
  float fH;
  float fW;
  float z_far_local;
  float z_near_local;
  float aspect_local;
  float fovy_local;
  float *result_local;
  
  fVar1 = tanf((-fovy / 360.0) * 3.1415925);
  fVar1 = fVar1 * z_near;
  GPU_MatrixFrustum(result,-(fVar1 * -aspect),fVar1 * -aspect,-fVar1,fVar1,z_near,z_far);
  return;
}

Assistant:

void GPU_MatrixPerspective(float* result, float fovy, float aspect, float z_near, float z_far)
{
	float fW, fH;
    
    // Make it left-handed?
    fovy = -fovy;
    aspect = -aspect;
    
	fH = tanf((fovy / 360) * PI) * z_near;
	fW = fH * aspect;
	GPU_MatrixFrustum(result, -fW, fW, -fH, fH, z_near, z_far);
}